

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_and_subfaces<short[4]>
          (Simplex_tree<MiniSTOptions> *this,short (*Nsimplex) [4],Filtration_value *filtration)

{
  short sVar1;
  long lVar2;
  bool bVar3;
  Vertex_handle VVar4;
  iterator iVar5;
  reference psVar6;
  iterator iVar7;
  difference_type dVar8;
  int *piVar9;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> first_00;
  undefined8 extraout_RDX;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar11;
  int local_d8;
  undefined1 local_d1;
  undefined8 *local_d0;
  short local_c2;
  iterator iStack_c0;
  Vertex_handle v;
  iterator __end0;
  iterator __begin0;
  vector<short,_std::allocator<short>_> *__range3;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_a0;
  const_iterator local_98;
  const_iterator local_90;
  short *local_88;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_80;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_78;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> last_unique;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_58;
  const_iterator local_50;
  bool local_41;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>
  local_40;
  short *local_38;
  short *last;
  short *first;
  Filtration_value *filtration_local;
  short (*Nsimplex_local) [4];
  Simplex_tree<MiniSTOptions> *this_local;
  undefined8 uVar10;
  
  filtration_local = filtration;
  Nsimplex_local = Nsimplex;
  this_local = this;
  last = std::begin<short_const,4ul>((short (*) [4])filtration);
  local_38 = std::end<short_const,4ul>((short (*) [4])filtration_local);
  if (last == local_38) {
    null_simplex();
    local_41 = true;
    std::
    pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
    ::
    pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool,_true>
              ((pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
                *)this,&local_40,&local_41);
    uVar10 = extraout_RDX;
  }
  else {
    if ((char)in_FS_OFFSET[-0x19] == '\0') {
      lVar2 = *in_FS_OFFSET;
      std::vector<short,_std::allocator<short>_>::vector
                ((vector<short,_std::allocator<short>_> *)(lVar2 + -0xe0));
      __cxa_thread_atexit(std::vector<short,_std::allocator<short>_>::~vector,
                          (vector<short,_std::allocator<short>_> *)(lVar2 + -0xe0),&__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
    }
    std::vector<short,_std::allocator<short>_>::clear
              ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    lVar2 = *in_FS_OFFSET;
    local_58._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::end
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_50
               ,&local_58);
    std::vector<short,std::allocator<short>>::insert<short_const*,void>
              ((vector<short,std::allocator<short>> *)(lVar2 + -0xe0),local_50,last,local_38);
    iVar5 = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    last_unique._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::end
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    std::sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
              ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               iVar5._M_current,last_unique);
    local_80._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::begin
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    local_88 = (short *)std::vector<short,_std::allocator<short>_>::end
                                  ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0))
    ;
    local_78 = std::
               unique<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                         (local_80,(__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>
                                    )local_88);
    lVar2 = *in_FS_OFFSET;
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_90
               ,&local_78);
    local_a0._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::end
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_98
               ,&local_a0);
    std::vector<short,_std::allocator<short>_>::erase
              ((vector<short,_std::allocator<short>_> *)(lVar2 + -0xe0),local_90,local_98);
    lVar2 = *in_FS_OFFSET;
    __end0 = std::vector<short,_std::allocator<short>_>::begin
                       ((vector<short,_std::allocator<short>_> *)(lVar2 + -0xe0));
    iStack_c0 = std::vector<short,_std::allocator<short>_>::end
                          ((vector<short,_std::allocator<short>_> *)(lVar2 + -0xe0));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff40);
      if (!bVar3) break;
      psVar6 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&__end0);
      sVar1 = *psVar6;
      local_c2 = sVar1;
      VVar4 = null_vertex((Simplex_tree<MiniSTOptions> *)Nsimplex);
      local_d1 = 0;
      if (sVar1 == VVar4) {
        local_d0 = (undefined8 *)__cxa_allocate_exception(8);
        local_d1 = 1;
        *local_d0 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(local_d0,&char_const*::typeinfo,0);
      }
      __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::operator++
                (&__end0);
    }
    iVar5 = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    iVar7 = std::vector<short,_std::allocator<short>_>::end
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    dVar8 = std::
            distance<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                      ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                       iVar5._M_current,
                       (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                       iVar7._M_current);
    local_d8 = (int)dVar8 + -1;
    piVar9 = std::max<int>((int *)(Nsimplex + 0x10),&local_d8);
    *(int *)Nsimplex[0x10] = *piVar9;
    first_00._M_current = (short *)root((Simplex_tree<MiniSTOptions> *)Nsimplex);
    iVar5 = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    iVar7 = std::vector<short,_std::allocator<short>_>::end
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0xe0));
    pVar11 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                       (this,(Siblings *)Nsimplex,first_00,
                        (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                        iVar5._M_current,(Filtration_value *)iVar7._M_current);
    uVar10 = pVar11._8_8_;
  }
  pVar11._8_8_ = uVar10;
  pVar11.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar11;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }